

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  size_t *psVar10;
  size_t sVar11;
  char *__s;
  char *local_88;
  char **local_80;
  size_t *local_78;
  URLGlob *local_70;
  char numbuf [18];
  dynbuf dyn;
  
  *result = (char *)0x0;
  local_88 = filename;
  local_80 = result;
  curlx_dyn_init(&dyn,0x2800);
  local_78 = &glob[-1].size;
  sVar2 = 1;
  sVar11 = 0;
  pcVar8 = "";
  local_70 = glob;
  do {
    __s = local_88;
    sVar7 = sVar2;
    if (*local_88 == '#') {
      iVar4 = Curl_isdigit((uint)(byte)local_88[1]);
      if (iVar4 == 0) goto LAB_0011c2e2;
      pcVar1 = __s + 1;
      uVar6 = strtoul(pcVar1,&local_88,10);
      if ((uVar6 != 0) && (uVar6 < local_70->size)) {
        lVar9 = local_70->size + 1;
        psVar3 = local_78;
        do {
          psVar10 = psVar3;
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_0011c2f3;
          psVar3 = psVar10 + 6;
        } while (*(int *)((long)psVar10 + 0x34) != (int)uVar6 + -1);
        iVar4 = (int)psVar10[6];
        if (iVar4 == 3) {
          __s = numbuf;
          curl_msnprintf(__s,0x12,"%0*lu",*(int *)(psVar10 + 9),psVar10[10]);
LAB_0011c341:
          sVar7 = strlen(__s);
          pcVar1 = local_88;
        }
        else {
          pcVar1 = local_88;
          if (iVar4 == 2) {
            numbuf[0] = *(char *)((long)psVar10 + 0x3a);
            numbuf[1] = '\0';
            __s = numbuf;
          }
          else {
            if (iVar4 != 1) {
              curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n");
              curlx_dyn_free(&dyn);
              return CURLE_FAILED_INIT;
            }
            sVar7 = sVar11;
            __s = pcVar8;
            if (psVar10[7] != 0) {
              __s = *(char **)(psVar10[7] + (long)*(int *)((long)psVar10 + 0x44) * 8);
              goto LAB_0011c341;
            }
          }
        }
      }
    }
    else {
      if (*local_88 == '\0') {
        pcVar8 = curlx_dyn_ptr(&dyn);
        *local_80 = pcVar8;
        return CURLE_OK;
      }
LAB_0011c2e2:
      pcVar1 = __s + 1;
    }
LAB_0011c2f3:
    local_88 = pcVar1;
    CVar5 = curlx_dyn_addn(&dyn,__s,sVar7);
    sVar11 = sVar7;
    pcVar8 = __s;
    if (CVar5 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, struct URLGlob *glob)
{
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      struct URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*lu",
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* MSDOS || WIN32 */
}